

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  char *__s1;
  ostream *poVar2;
  long in_RSI;
  int in_EDI;
  bool hasError;
  char *libraryVersion;
  int i;
  bool useStream;
  bool badFileFound;
  bool enableCoreCheck;
  bool reduceTime;
  bool reduceMemory;
  undefined1 in_stack_000002e4;
  undefined1 in_stack_000002e5;
  undefined1 in_stack_000002e6;
  undefined1 in_stack_000002e7;
  char *in_stack_000002e8;
  char *in_stack_ffffffffffffffc8;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  int local_1c;
  byte local_14;
  uint local_4;
  
  if (in_EDI < 2) {
    usageMessage((ostream *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffc8,false);
    local_4 = 1;
  }
  else {
    local_14 = 0;
    for (local_1c = 1; local_1c < in_EDI; local_1c = local_1c + 1) {
      iVar1 = strcmp(*(char **)(in_RSI + (long)local_1c * 8),"-h");
      if ((iVar1 == 0) ||
         (iVar1 = strcmp(*(char **)(in_RSI + (long)local_1c * 8),"--help"), iVar1 == 0)) {
        usageMessage((ostream *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffc8,false);
        return 0;
      }
      iVar1 = strcmp(*(char **)(in_RSI + (long)local_1c * 8),"-m");
      if ((((iVar1 != 0) &&
           (iVar1 = strcmp(*(char **)(in_RSI + (long)local_1c * 8),"-t"), iVar1 != 0)) &&
          (iVar1 = strcmp(*(char **)(in_RSI + (long)local_1c * 8),"-s"), iVar1 != 0)) &&
         (iVar1 = strcmp(*(char **)(in_RSI + (long)local_1c * 8),"-c"), iVar1 != 0)) {
        iVar1 = strcmp(*(char **)(in_RSI + (long)local_1c * 8),"--version");
        if (iVar1 == 0) {
          __s1 = (char *)Imf_3_2::getLibraryVersion();
          poVar2 = std::operator<<((ostream *)&std::cout,"exrcheck (OpenEXR) ");
          std::operator<<(poVar2,"3.2.0");
          iVar1 = strcmp(__s1,"3.2.0");
          if (iVar1 != 0) {
            poVar2 = std::operator<<((ostream *)&std::cout,"(OpenEXR version ");
            poVar2 = std::operator<<(poVar2,__s1);
            std::operator<<(poVar2,")");
          }
          poVar2 = std::operator<<((ostream *)&std::cout," https://openexr.com");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          poVar2 = std::operator<<((ostream *)&std::cout,
                                   "Copyright (c) Contributors to the OpenEXR Project");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          poVar2 = std::operator<<((ostream *)&std::cout,"License BSD-3-Clause");
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          return 0;
        }
        iVar1 = access(*(char **)(in_RSI + (long)local_1c * 8),4);
        if (iVar1 != 0) {
          poVar2 = std::operator<<((ostream *)&std::cerr,"No such file: ");
          poVar2 = std::operator<<(poVar2,*(char **)(in_RSI + (long)local_1c * 8));
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
          return -1;
        }
        poVar2 = std::operator<<((ostream *)&std::cout," file ");
        poVar2 = std::operator<<(poVar2,*(char **)(in_RSI + (long)local_1c * 8));
        std::operator<<(poVar2,' ');
        std::ostream::flush();
        in_stack_ffffffffffffffd7 =
             exrCheck(in_stack_000002e8,(bool)in_stack_000002e7,(bool)in_stack_000002e6,
                      (bool)in_stack_000002e5,(bool)in_stack_000002e4);
        if ((bool)in_stack_ffffffffffffffd7) {
          std::operator<<((ostream *)&std::cout,"bad\n");
          local_14 = 1;
        }
        else {
          std::operator<<((ostream *)&std::cout,"OK\n");
        }
      }
    }
    local_4 = (uint)local_14;
  }
  return local_4;
}

Assistant:

int
main (int argc, char** argv)
{
    if (argc < 2)
    {
        usageMessage (cerr, argv[0], false);
        return 1;
    }

    bool reduceMemory    = false;
    bool reduceTime      = false;
    bool enableCoreCheck = false;
    bool badFileFound    = false;
    bool useStream       = false;
    for (int i = 1; i < argc; ++i)
    {
        if (!strcmp (argv[i], "-h") || !strcmp (argv[i], "--help"))
        {
            usageMessage (cout, "exrcheck", true);
            return 0;
        }
        else if (!strcmp (argv[i], "-m"))
        {
            //
            // note for further memory reduction, calls to the following could be added here
            // CompositeDeepScanLine::setMaximumSampleCount();
            // Header::setMaxImageSize();
            // Header::setMaxTileSize();

            reduceMemory = true;

        }
        else if (!strcmp (argv[i], "-t"))
        {
            reduceTime = true;
        }
        else if (!strcmp (argv[i], "-s"))
        {
            useStream = true;
        }
        else if (!strcmp (argv[i], "-c"))
        {
            enableCoreCheck = true;
        }
        else if (!strcmp (argv[i], "--version"))
        {
            const char* libraryVersion = getLibraryVersion();
            
            cout << "exrcheck (OpenEXR) " << OPENEXR_VERSION_STRING;
            if (strcmp(libraryVersion, OPENEXR_VERSION_STRING))
                cout << "(OpenEXR version " << libraryVersion << ")";
            cout << " https://openexr.com" << endl;
            cout << "Copyright (c) Contributors to the OpenEXR Project" << endl;
            cout << "License BSD-3-Clause" << endl;

            return 0;
        }
        else
        {

#if defined _WIN32 || defined _WIN64
            if (_access (argv[i], 4) != 0)
#else
            if (access (argv[i], R_OK) != 0)
#endif
            {
                cerr << "No such file: " << argv[i] << endl;
                return -1;
            }

            cout << " file " << argv[i] << ' ';
            cout.flush ();

            bool hasError = exrCheck (
                argv[i], reduceMemory, reduceTime, useStream, enableCoreCheck);
            if (hasError)
            {
                cout << "bad\n";
                badFileFound = true;
            }
            else
            {
                cout << "OK\n";
            }
        }
    }

    return badFileFound;
}